

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_peeling.cpp
# Opt level: O2

void __thiscall spvtools::opt::LoopPeeling::PeelAfter(LoopPeeling *this,uint32_t peel_factor)

{
  IRContext *context;
  Loop *this_00;
  bool bVar1;
  uint32_t op1;
  uint32_t op2;
  Instruction *this_01;
  Instruction *condition;
  BasicBlock *pBVar2;
  BasicBlock *pBVar3;
  _Any_data local_168;
  code *local_158;
  code *local_150;
  InstructionBuilder builder;
  LoopCloningResult clone_results;
  
  bVar1 = CanPeelLoop(this);
  if (bVar1) {
    LoopUtils::LoopCloningResult::LoopCloningResult(&clone_results);
    DuplicateAndConnectLoop(this,&clone_results);
    InsertCanonicalInductionVariable(this,&clone_results);
    context = this->context_;
    BasicBlock::tail((BasicBlock *)&local_168);
    InstructionBuilder::InstructionBuilder
              (&builder,context,(Instruction *)local_168._M_unused._0_8_,
               kAnalysisInstrToBlockMapping|kAnalysisBegin);
    this_01 = InstructionBuilder::GetIntConstant<unsigned_int>
                        (&builder,peel_factor,this->int_type_->signed_);
    op1 = Instruction::result_id(this_01);
    op2 = Instruction::result_id(this->loop_iteration_count_);
    condition = InstructionBuilder::AddLessThan(&builder,op1,op2);
    local_150 = std::
                _Function_handler<unsigned_int_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/loop_peeling.cpp:498:20)>
                ::_M_invoke;
    local_158 = std::
                _Function_handler<unsigned_int_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/loop_peeling.cpp:498:20)>
                ::_M_manager;
    local_168._M_unused._M_object = this_01;
    local_168._8_8_ = this;
    FixExitCondition(this,(function<unsigned_int_(spvtools::opt::Instruction_*)> *)&local_168);
    if (local_158 != (code *)0x0) {
      (*local_158)(&local_168,&local_168,3);
    }
    this_00 = this->cloned_loop_;
    pBVar2 = CreateBlockBefore(this,this->loop_->loop_preheader_);
    Loop::SetMergeBlock(this_00,pBVar2);
    pBVar3 = ProtectLoop(this,this->cloned_loop_,condition,this->loop_->loop_preheader_);
    pBVar2 = this->loop_->loop_header_;
    local_168._8_8_ = 0;
    local_168._M_unused._M_object = operator_new(0x18);
    *(LoopCloningResult **)local_168._M_unused._0_8_ = &clone_results;
    *(BasicBlock **)((long)local_168._M_unused._0_8_ + 8) = pBVar3;
    *(LoopPeeling **)((long)local_168._M_unused._0_8_ + 0x10) = this;
    local_150 = std::
                _Function_handler<void_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/loop_peeling.cpp:533:7)>
                ::_M_invoke;
    local_158 = std::
                _Function_handler<void_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/loop_peeling.cpp:533:7)>
                ::_M_manager;
    BasicBlock::ForEachPhiInst
              (pBVar2,(function<void_(spvtools::opt::Instruction_*)> *)&local_168,false);
    if (local_158 != (code *)0x0) {
      (*local_158)(&local_168,&local_168,3);
    }
    IRContext::InvalidateAnalysesExceptFor
              (this->context_,
               kAnalysisLoopAnalysis|kAnalysisCFG|kAnalysisInstrToBlockMapping|kAnalysisBegin);
    LoopUtils::LoopCloningResult::~LoopCloningResult(&clone_results);
    return;
  }
  __assert_fail("CanPeelLoop() && \"Cannot peel loop\"",
                "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/loop_peeling.cpp"
                ,0x1dd,"void spvtools::opt::LoopPeeling::PeelAfter(uint32_t)");
}

Assistant:

void LoopPeeling::PeelAfter(uint32_t peel_factor) {
  assert(CanPeelLoop() && "Cannot peel loop");
  LoopUtils::LoopCloningResult clone_results;

  // Clone the loop and insert the cloned one before the loop.
  DuplicateAndConnectLoop(&clone_results);

  // Add a canonical induction variable "canonical_induction_variable_".
  InsertCanonicalInductionVariable(&clone_results);

  InstructionBuilder builder(
      context_, &*cloned_loop_->GetPreHeaderBlock()->tail(),
      IRContext::kAnalysisDefUse | IRContext::kAnalysisInstrToBlockMapping);
  Instruction* factor =
      builder.GetIntConstant(peel_factor, int_type_->IsSigned());

  Instruction* has_remaining_iteration = builder.AddLessThan(
      factor->result_id(), loop_iteration_count_->result_id());

  // Change the exit condition of the cloned loop to be (exit when become
  // false):
  //  "canonical_induction_variable_" + "factor" < "loop_iteration_count_"
  FixExitCondition([factor, this](Instruction* insert_before_point) {
    InstructionBuilder cond_builder(
        context_, insert_before_point,
        IRContext::kAnalysisDefUse | IRContext::kAnalysisInstrToBlockMapping);
    // Build the following check: canonical_induction_variable_ + factor <
    // iteration_count
    return cond_builder
        .AddLessThan(cond_builder
                         .AddIAdd(canonical_induction_variable_->type_id(),
                                  canonical_induction_variable_->result_id(),
                                  factor->result_id())
                         ->result_id(),
                     loop_iteration_count_->result_id())
        ->result_id();
  });

  // "Protect" the first loop: the first loop can only be executed if
  // factor < loop_iteration_count_.

  // The original loop's pre-header was the cloned loop merge block.
  GetClonedLoop()->SetMergeBlock(
      CreateBlockBefore(GetOriginalLoop()->GetPreHeaderBlock()));
  // Use the second loop preheader as if merge block.

  // Prevent the first loop if only the peeled loop needs it.
  BasicBlock* if_block = ProtectLoop(cloned_loop_, has_remaining_iteration,
                                     GetOriginalLoop()->GetPreHeaderBlock());

  // Patch the phi of the header block.
  // We added an if to enclose the first loop and because the phi node are
  // connected to the exit value of the first loop, the definition no longer
  // dominate the preheader.
  // We had to the preheader (our if merge block) the required phi instruction
  // and patch the header phi.
  GetOriginalLoop()->GetHeaderBlock()->ForEachPhiInst(
      [&clone_results, if_block, this](Instruction* phi) {
        analysis::DefUseManager* def_use_mgr = context_->get_def_use_mgr();

        auto find_value_idx = [](Instruction* phi_inst, Loop* loop) {
          uint32_t preheader_value_idx =
              !loop->IsInsideLoop(phi_inst->GetSingleWordInOperand(1)) ? 0 : 2;
          return preheader_value_idx;
        };

        Instruction* cloned_phi =
            def_use_mgr->GetDef(clone_results.value_map_.at(phi->result_id()));
        uint32_t cloned_preheader_value = cloned_phi->GetSingleWordInOperand(
            find_value_idx(cloned_phi, GetClonedLoop()));

        Instruction* new_phi =
            InstructionBuilder(context_,
                               &*GetOriginalLoop()->GetPreHeaderBlock()->tail(),
                               IRContext::kAnalysisDefUse |
                                   IRContext::kAnalysisInstrToBlockMapping)
                .AddPhi(phi->type_id(),
                        {phi->GetSingleWordInOperand(
                             find_value_idx(phi, GetOriginalLoop())),
                         GetClonedLoop()->GetMergeBlock()->id(),
                         cloned_preheader_value, if_block->id()});

        phi->SetInOperand(find_value_idx(phi, GetOriginalLoop()),
                          {new_phi->result_id()});
        def_use_mgr->AnalyzeInstUse(phi);
      });

  context_->InvalidateAnalysesExceptFor(
      IRContext::kAnalysisDefUse | IRContext::kAnalysisInstrToBlockMapping |
      IRContext::kAnalysisLoopAnalysis | IRContext::kAnalysisCFG);
}